

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_helpers.cpp
# Opt level: O2

bool midi_processor::process_file
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,char *p_extension,
               midi_container *p_out)

{
  bool bVar1;
  
  bVar1 = is_standard_midi(p_file);
  if (bVar1) {
    bVar1 = process_standard_midi(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_riff_midi(p_file);
  if (bVar1) {
    bVar1 = process_riff_midi(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_hmp(p_file);
  if (bVar1) {
    bVar1 = process_hmp(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_hmi(p_file);
  if (bVar1) {
    bVar1 = process_hmi(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_xmi(p_file);
  if (bVar1) {
    bVar1 = process_xmi(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_mus(p_file);
  if (bVar1) {
    bVar1 = process_mus(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_mids(p_file);
  if (bVar1) {
    bVar1 = process_mids(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_lds(p_file,p_extension);
  if (bVar1) {
    bVar1 = process_lds(p_file,p_out);
    return bVar1;
  }
  bVar1 = is_gmf(p_file);
  if (bVar1) {
    bVar1 = process_gmf(p_file,p_out);
    return bVar1;
  }
  return false;
}

Assistant:

bool midi_processor::process_file( std::vector<uint8_t> const& p_file, const char * p_extension, midi_container & p_out )
{
    if ( is_standard_midi( p_file ) )
    {
        return process_standard_midi( p_file, p_out );
    }
    else if ( is_riff_midi( p_file ) )
    {
        return process_riff_midi( p_file, p_out );
    }
    else if ( is_hmp( p_file ) )
    {
        return process_hmp( p_file, p_out );
    }
    else if ( is_hmi( p_file ) )
    {
        return process_hmi( p_file, p_out );
    }
    else if ( is_xmi( p_file ) )
    {
        return process_xmi( p_file, p_out );
    }
    else if ( is_mus( p_file ) )
    {
        return process_mus( p_file, p_out );
    }
    else if ( is_mids( p_file ) )
    {
        return process_mids( p_file, p_out );
    }
    else if ( is_lds( p_file, p_extension ) )
    {
        return process_lds( p_file, p_out );
    }
    else if ( is_gmf( p_file ) )
    {
        return process_gmf( p_file, p_out );
    }
    else return false;
}